

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O1

LPWSTR lstrcatW(LPWSTR lpString1,LPCWSTR lpString2)

{
  LPWSTR pWVar1;
  LPWSTR pWVar2;
  WCHAR WVar3;
  long lVar4;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pWVar1 = lpString1;
  if (lpString2 == (LPCWSTR)0x0 || lpString1 == (LPWSTR)0x0) {
    lpString1 = (LPWSTR)0x0;
  }
  else {
    do {
      pWVar2 = pWVar1;
      pWVar1 = pWVar2 + 1;
    } while (*pWVar2 != L'\0');
    WVar3 = *lpString2;
    if (WVar3 != L'\0') {
      lVar4 = -2;
      do {
        *(WCHAR *)((long)pWVar1 + lVar4) = WVar3;
        WVar3 = *(WCHAR *)((long)lpString2 + lVar4 + 4);
        lVar4 = lVar4 + 2;
      } while (WVar3 != L'\0');
      pWVar2 = (LPWSTR)((long)pWVar1 + lVar4);
    }
    *pWVar2 = L'\0';
  }
  return lpString1;
}

Assistant:

LPWSTR
PALAPI
lstrcatW(
	 IN OUT LPWSTR lpString1,
	 IN LPCWSTR lpString2)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcatW);
    ENTRY("lstrcatW (lpString1=%p (%S), lpString2=%p (%S))\n",
          lpString1?lpString1:W16_NULLSTRING,
          lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcatW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcatW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcatW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcatW);
        return NULL;
    }

    /* find end of source string */
    while (*lpString1)
    {
        lpString1++;
    }

    /* concatenate new string */
    while(*lpString2)
    {
        *lpString1++ = *lpString2++;
    }

    /* add terminating null */
    *lpString1 = '\0';

    LOGEXIT("lstrcatW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcatW);
    return lpStart;
}